

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

int ov_pcm_seek_page(OggVorbis_File *vf,ogg_int64_t pos)

{
  ogg_stream_state *os;
  ogg_int64_t *poVar1;
  ogg_int64_t oVar2;
  uint uVar3;
  ogg_int64_t oVar4;
  long lVar5;
  ogg_int64_t oVar6;
  ulong uVar7;
  ulong offset;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  ogg_page og_1;
  ogg_page og;
  ogg_packet op;
  ulong local_e0;
  long local_d0;
  long local_c0;
  ulong local_b8;
  ogg_page local_a8;
  ogg_page local_80;
  ogg_packet local_60;
  
  oVar4 = ov_pcm_total(vf,-1);
  if (vf->ready_state < 2) {
    return -0x83;
  }
  if (vf->seekable == 0) {
    return -0x8a;
  }
  if (oVar4 < pos || pos < 0) {
    return -0x83;
  }
  uVar12 = vf->links;
  uVar8 = (int)uVar12 >> 0x1f & uVar12;
  uVar3 = uVar8 - 1;
  poVar1 = vf->pcmlengths;
  iVar11 = uVar12 * 2;
  do {
    uVar9 = uVar12;
    if ((int)uVar9 < 1) {
      iVar11 = uVar3 * 2;
      uVar9 = uVar8;
      uVar12 = uVar3;
      break;
    }
    oVar4 = oVar4 - poVar1[iVar11 - 1];
    uVar12 = uVar9 - 1;
    iVar11 = iVar11 + -2;
  } while (pos < oVar4);
  uVar14 = vf->offsets[(int)uVar9];
  uVar13 = vf->dataoffsets[(int)uVar12];
  local_d0 = poVar1[iVar11];
  local_c0 = poVar1[iVar11 + 1] + local_d0;
  if (uVar13 == uVar14) {
    uVar3 = _seek_helper(vf,uVar14);
    if (uVar3 == 0) {
      uVar7 = _get_next_page(vf,&local_80,1);
      bVar15 = true;
      if ((long)uVar7 < 0) goto LAB_001a97f8;
      goto LAB_001a924d;
    }
LAB_001a9230:
    uVar7 = (ulong)uVar3;
    goto LAB_001a97f8;
  }
  uVar7 = 0;
  bVar15 = false;
LAB_001a924d:
  if ((long)uVar13 < (long)uVar14) {
    lVar5 = (pos - oVar4) + local_d0;
    local_e0 = 0xffffffffffffffff;
    do {
      local_b8 = uVar13;
      if ((0xffff < (long)(uVar14 - uVar13)) &&
         (local_b8 = (uVar13 + (long)(((double)(long)(uVar14 - uVar13) * (double)(lVar5 - local_d0))
                                     / (double)(local_c0 - local_d0))) - 0x10000,
         (long)local_b8 < (long)(uVar13 + 0x10000))) {
        local_b8 = uVar13;
      }
      uVar3 = _seek_helper(vf,local_b8);
      if (uVar3 != 0) goto LAB_001a9230;
      if ((long)uVar13 < (long)uVar14) {
        do {
          uVar7 = _get_next_page(vf,&local_80,uVar14 - vf->offset);
          while( true ) {
            if (uVar7 == 0xffffffffffffff80) goto LAB_001a97f1;
            if ((long)uVar7 < 0) {
              if ((long)local_b8 <= (long)(uVar13 + 1)) goto LAB_001a95ba;
              if (local_b8 == 0) goto LAB_001a97f8;
              uVar7 = local_b8 - 0x10000;
              local_b8 = uVar13 + 1;
              if ((long)uVar13 < (long)uVar7) {
                local_b8 = uVar7;
              }
              uVar3 = _seek_helper(vf,local_b8);
              if (uVar3 != 0) goto LAB_001a9230;
              goto LAB_001a93af;
            }
            iVar11 = ogg_page_serialno(&local_80);
            if ((vf->serialnos[(int)uVar12] == (long)iVar11) &&
               (oVar6 = ogg_page_granulepos(&local_80), oVar6 != -1)) break;
            uVar7 = _get_next_page(vf,&local_80,uVar14 - vf->offset);
            bVar15 = true;
          }
          if (oVar6 < lVar5) {
            uVar13 = vf->offset;
            bVar15 = true;
            local_b8 = uVar13;
            local_e0 = uVar7;
            local_d0 = oVar6;
            oVar2 = local_c0;
            if (0xac44 < lVar5 - oVar6) {
LAB_001a9479:
              local_c0 = oVar2;
              bVar15 = true;
              break;
            }
          }
          else {
            if ((long)local_b8 <= (long)(uVar13 + 1)) {
              bVar15 = true;
              goto LAB_001a95ba;
            }
            bVar15 = uVar14 != vf->offset;
            uVar14 = local_b8;
            oVar2 = oVar6;
            if (bVar15) goto LAB_001a9479;
            uVar14 = local_b8 - 0x10000;
            local_b8 = uVar13 + 1;
            if ((long)uVar13 < (long)uVar14) {
              local_b8 = uVar14;
            }
            uVar3 = _seek_helper(vf,local_b8);
            if (uVar3 != 0) goto LAB_001a9230;
            bVar15 = true;
            uVar14 = uVar7;
LAB_001a93af:
            uVar7 = 0;
          }
        } while ((long)uVar13 < (long)uVar14);
      }
      else {
        uVar7 = 0;
      }
    } while ((long)uVar13 < (long)uVar14);
LAB_001a95ba:
    if (local_e0 != 0xffffffffffffffff) {
      uVar3 = _seek_helper(vf,local_e0);
      vf->pcm_offset = -1;
      if (uVar3 == 0) {
        uVar7 = _get_next_page(vf,&local_a8,-1);
        if (-1 < (long)uVar7) {
          if (uVar12 == vf->current_link) {
            vorbis_synthesis_restart(&vf->vd);
            lVar5 = vf->current_serialno;
          }
          else {
            vorbis_dsp_clear(&vf->vd);
            vorbis_block_clear(&vf->vb);
            vf->current_link = uVar12;
            lVar5 = vf->serialnos[(int)uVar12];
            vf->current_serialno = lVar5;
            vf->ready_state = 3;
          }
          os = &vf->os;
          ogg_stream_reset_serialno(os,(int)lVar5);
          ogg_stream_pagein(os,&local_a8);
          do {
            iVar11 = ogg_stream_packetpeek(os,&local_60);
            if (iVar11 == 0) {
              uVar14 = local_e0;
              uVar13 = local_e0;
              if ((long)local_e0 <= vf->dataoffsets[(int)uVar12]) goto LAB_001a97ca;
LAB_001a96af:
              do {
                if ((long)uVar14 < 0x10001) {
                  uVar14 = 0x10000;
                }
                uVar3 = _seek_helper(vf,uVar14 - 0x10000);
                if (uVar3 != 0) goto LAB_001a9230;
                lVar5 = vf->offset;
                uVar7 = 0xffffffffffffffff;
                if (lVar5 < (long)uVar13) {
                  do {
                    local_a8.body = (uchar *)0x0;
                    local_a8.body_len = 0;
                    local_a8.header = (uchar *)0x0;
                    local_a8.header_len = 0;
                    offset = _get_next_page(vf,&local_a8,uVar13 - lVar5);
                    if (offset == 0xffffffffffffff80) goto LAB_001a97f1;
                    if ((long)offset < 0) goto LAB_001a972c;
                    lVar5 = vf->offset;
                    uVar7 = offset;
                  } while (lVar5 < (long)uVar13);
                }
                else {
LAB_001a972c:
                  offset = uVar7;
                  uVar14 = uVar14 - 0x10000;
                  if (offset == 0xffffffffffffffff) goto LAB_001a96af;
                }
                if (local_a8.header_len == 0) {
                  uVar3 = _seek_helper(vf,offset);
                  if (uVar3 != 0) goto LAB_001a9230;
                  oVar6 = _get_next_page(vf,&local_a8,0x10000);
                  if (oVar6 < 0) {
                    uVar7 = 0xffffffffffffff7f;
                    goto LAB_001a97f8;
                  }
                }
                iVar11 = ogg_page_serialno(&local_a8);
                if ((vf->current_serialno == (long)iVar11) &&
                   ((oVar6 = ogg_page_granulepos(&local_a8), -1 < oVar6 ||
                    (iVar11 = ogg_page_continued(&local_a8), iVar11 == 0)))) {
                  iVar11 = ov_raw_seek(vf,offset);
                  return iVar11;
                }
                uVar14 = offset;
                uVar13 = offset;
              } while (vf->dataoffsets[(int)uVar12] < (long)offset);
            }
            else {
              uVar14 = (long)iVar11;
LAB_001a97ca:
              if ((long)uVar14 < 0) {
                uVar7 = 0xffffffffffffff78;
                break;
              }
            }
            if (local_60.granulepos != -1) goto LAB_001a9840;
            ogg_stream_packetout(os,(ogg_packet *)0x0);
          } while( true );
        }
        goto LAB_001a97f8;
      }
      goto LAB_001a9230;
    }
  }
  if (((!bVar15) || (uVar13 != vf->dataoffsets[(int)uVar12])) ||
     (iVar11 = ogg_page_serialno(&local_80), vf->serialnos[(int)uVar12] != (long)iVar11))
  goto LAB_001a97f8;
  vf->pcm_offset = oVar4;
  if (uVar12 == vf->current_link) {
    vorbis_synthesis_restart(&vf->vd);
    lVar5 = vf->current_serialno;
  }
  else {
    vorbis_dsp_clear(&vf->vd);
    vorbis_block_clear(&vf->vb);
    vf->current_link = uVar12;
    lVar5 = vf->serialnos[(int)uVar12];
    vf->current_serialno = lVar5;
    vf->ready_state = 3;
  }
  ogg_stream_reset_serialno(&vf->os,(int)lVar5);
  ogg_stream_pagein(&vf->os,&local_80);
  lVar5 = vf->pcm_offset;
LAB_001a9575:
  uVar7 = 0xffffffffffffff7f;
  if ((lVar5 <= pos) && (oVar4 = ov_pcm_total(vf,-1), pos <= oVar4)) {
    vf->bittrack = 0.0;
    vf->samptrack = 0.0;
    return 0;
  }
LAB_001a97f8:
  vf->pcm_offset = -1;
  vorbis_dsp_clear(&vf->vd);
  vorbis_block_clear(&vf->vb);
  vf->ready_state = 2;
  return (int)uVar7;
LAB_001a97f1:
  uVar7 = 0xffffffffffffff80;
  goto LAB_001a97f8;
LAB_001a9840:
  lVar10 = local_60.granulepos - vf->pcmlengths[(long)vf->current_link * 2];
  lVar5 = 0;
  if (0 < lVar10) {
    lVar5 = lVar10;
  }
  lVar5 = lVar5 + oVar4;
  vf->pcm_offset = lVar5;
  goto LAB_001a9575;
}

Assistant:

int ov_pcm_seek_page(OggVorbis_File *vf,ogg_int64_t pos){
  int link=-1;
  ogg_int64_t result=0;
  ogg_int64_t total=ov_pcm_total(vf,-1);

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)return(OV_ENOSEEK);

  if(pos<0 || pos>total)return(OV_EINVAL);

  /* which bitstream section does this pcm offset occur in? */
  for(link=vf->links-1;link>=0;link--){
    total-=vf->pcmlengths[link*2+1];
    if(pos>=total)break;
  }

  /* Search within the logical bitstream for the page with the highest
     pcm_pos preceding pos.  If we're looking for a position on the
     first page, bisection will halt without finding our position as
     it's before the first explicit granulepos fencepost. That case is
     handled separately below.

     There is a danger here; missing pages or incorrect frame number
     information in the bitstream could make our task impossible.
     Account for that (it would be an error condition) */

  /* new search algorithm originally by HB (Nicholas Vinen) */

  {
    ogg_int64_t end=vf->offsets[link+1];
    ogg_int64_t begin=vf->dataoffsets[link];
    ogg_int64_t begintime = vf->pcmlengths[link*2];
    ogg_int64_t endtime = vf->pcmlengths[link*2+1]+begintime;
    ogg_int64_t target=pos-total+begintime;
    ogg_int64_t best=-1;
    int         got_page=0;

    ogg_page og;

    /* if we have only one page, there will be no bisection.  Grab the page here */
    if(begin==end){
      result=_seek_helper(vf,begin);
      if(result) goto seek_error;

      result=_get_next_page(vf,&og,1);
      if(result<0) goto seek_error;

      got_page=1;
    }

    /* bisection loop */
    while(begin<end){
      ogg_int64_t bisect;

      if(end-begin<CHUNKSIZE){
        bisect=begin;
      }else{
        /* take a (pretty decent) guess. */
        bisect=begin +
          (ogg_int64_t)((double)(target-begintime)*(end-begin)/(endtime-begintime))
          - CHUNKSIZE;
        if(bisect<begin+CHUNKSIZE)
          bisect=begin;
      }

      result=_seek_helper(vf,bisect);
      if(result) goto seek_error;

      /* read loop within the bisection loop */
      while(begin<end){
        result=_get_next_page(vf,&og,end-vf->offset);
        if(result==OV_EREAD) goto seek_error;
        if(result<0){
          /* there is no next page! */
          if(bisect<=begin+1)
              /* No bisection left to perform.  We've either found the
                 best candidate already or failed. Exit loop. */
            end=begin;
          else{
            /* We tried to load a fraction of the last page; back up a
               bit and try to get the whole last page */
            if(bisect==0) goto seek_error;
            bisect-=CHUNKSIZE;

            /* don't repeat/loop on a read we've already performed */
            if(bisect<=begin)bisect=begin+1;

            /* seek and cntinue bisection */
            result=_seek_helper(vf,bisect);
            if(result) goto seek_error;
          }
        }else{
          ogg_int64_t granulepos;
          got_page=1;

          /* got a page. analyze it */
          /* only consider pages from primary vorbis stream */
          if(ogg_page_serialno(&og)!=vf->serialnos[link])
            continue;

          /* only consider pages with the granulepos set */
          granulepos=ogg_page_granulepos(&og);
          if(granulepos==-1)continue;

          if(granulepos<target){
            /* this page is a successful candidate! Set state */

            best=result;  /* raw offset of packet with granulepos */
            begin=vf->offset; /* raw offset of next page */
            begintime=granulepos;

            /* if we're before our target but within a short distance,
               don't bisect; read forward */
            if(target-begintime>44100)break;

            bisect=begin; /* *not* begin + 1 as above */
          }else{

            /* This is one of our pages, but the granpos is
               post-target; it is not a bisection return
               candidate. (The only way we'd use it is if it's the
               first page in the stream; we handle that case later
               outside the bisection) */
            if(bisect<=begin+1){
              /* No bisection left to perform.  We've either found the
                 best candidate already or failed. Exit loop. */
              end=begin;
            }else{
              if(end==vf->offset){
                /* bisection read to the end; use the known page
                   boundary (result) to update bisection, back up a
                   little bit, and try again */
                end=result;
                bisect-=CHUNKSIZE;
                if(bisect<=begin)bisect=begin+1;
                result=_seek_helper(vf,bisect);
                if(result) goto seek_error;
              }else{
                /* Normal bisection */
                end=bisect;
                endtime=granulepos;
                break;
              }
            }
          }
        }
      }
    }

    /* Out of bisection: did it 'fail?' */
    if(best == -1){

      /* Check the 'looking for data in first page' special case;
         bisection would 'fail' because our search target was before the
         first PCM granule position fencepost. */

      if(got_page &&
         begin == vf->dataoffsets[link] &&
         ogg_page_serialno(&og)==vf->serialnos[link]){

        /* Yes, this is the beginning-of-stream case. We already have
           our page, right at the beginning of PCM data.  Set state
           and return. */

        vf->pcm_offset=total;

        if(link!=vf->current_link){
          /* Different link; dump entire decode machine */
          _decode_clear(vf);

          vf->current_link=link;
          vf->current_serialno=vf->serialnos[link];
          vf->ready_state=STREAMSET;

        }else{
          vorbis_synthesis_restart(&vf->vd);
        }

        ogg_stream_reset_serialno(&vf->os,vf->current_serialno);
        ogg_stream_pagein(&vf->os,&og);

      }else
        goto seek_error;

    }else{

      /* Bisection found our page. seek to it, update pcm offset. Easier case than
         raw_seek, don't keep packets preceding granulepos. */

      ogg_page og;
      ogg_packet op;

      /* seek */
      result=_seek_helper(vf,best);
      vf->pcm_offset=-1;
      if(result) goto seek_error;
      result=_get_next_page(vf,&og,-1);
      if(result<0) goto seek_error;

      if(link!=vf->current_link){
        /* Different link; dump entire decode machine */
        _decode_clear(vf);

        vf->current_link=link;
        vf->current_serialno=vf->serialnos[link];
        vf->ready_state=STREAMSET;

      }else{
        vorbis_synthesis_restart(&vf->vd);
      }

      ogg_stream_reset_serialno(&vf->os,vf->current_serialno);
      ogg_stream_pagein(&vf->os,&og);

      /* pull out all but last packet; the one with granulepos */
      while(1){
        result=ogg_stream_packetpeek(&vf->os,&op);
        if(result==0){
          /* No packet returned; we exited the bisection with 'best'
             pointing to a page with a granule position, so the packet
             finishing this page ('best') originated on a preceding
             page. Keep fetching previous pages until we get one with
             a granulepos or without the 'continued' flag set.  Then
             just use raw_seek for simplicity. */
          /* Do not rewind past the beginning of link data; if we do,
             it's either a bug or a broken stream */
          result=best;
          while(result>vf->dataoffsets[link]){
            result=_get_prev_page(vf,result,&og);
            if(result<0) goto seek_error;
            if(ogg_page_serialno(&og)==vf->current_serialno &&
               (ogg_page_granulepos(&og)>-1 ||
                !ogg_page_continued(&og))){
              return ov_raw_seek(vf,result);
            }
          }
        }
        if(result<0){
          result = OV_EBADPACKET;
          goto seek_error;
        }
        if(op.granulepos!=-1){
          vf->pcm_offset=op.granulepos-vf->pcmlengths[vf->current_link*2];
          if(vf->pcm_offset<0)vf->pcm_offset=0;
          vf->pcm_offset+=total;
          break;
        }else
          result=ogg_stream_packetout(&vf->os,NULL);
      }
    }
  }

  /* verify result */
  if(vf->pcm_offset>pos || pos>ov_pcm_total(vf,-1)){
    result=OV_EFAULT;
    goto seek_error;
  }
  vf->bittrack=0.f;
  vf->samptrack=0.f;
  return(0);

 seek_error:
  /* dump machine so we're in a known state */
  vf->pcm_offset=-1;
  _decode_clear(vf);
  return (int)result;
}